

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O2

void __thiscall
glcts::ArraysOfArrays::
ConstructorsAndUnsizedDeclUnsizedArrays3<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (ConstructorsAndUnsizedDeclUnsizedArrays3<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  TestError *this_00;
  string shader_source;
  string base_variable_string;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&base_variable_string,"    float[][] x = mat4(0);\n\n",
             (allocator<char> *)&shader_source);
  std::operator+(&shader_source,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 shader_start_abi_cxx11_,&base_variable_string);
  switch((ulong)tested_shader_type) {
  case 0:
  case 2:
  case 5:
    goto switchD_00b8d5bc_caseD_0;
  case 1:
    std::__cxx11::string::append((char *)&shader_source);
    goto switchD_00b8d5bc_caseD_0;
  case 3:
    break;
  case 4:
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0xa53);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::__cxx11::string::append((string *)&shader_source);
switchD_00b8d5bc_caseD_0:
  std::__cxx11::string::append((string *)&shader_source);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode.
    _vptr_TestNode[8])(this,(ulong)tested_shader_type,&shader_source);
  std::__cxx11::string::~string((string *)&shader_source);
  std::__cxx11::string::~string((string *)&base_variable_string);
  return;
}

Assistant:

void ConstructorsAndUnsizedDeclUnsizedArrays3<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string base_variable_string("    float[][] x = mat4(0);\n\n");

	std::string shader_source = shader_start + base_variable_string;

	/* End main */
	DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

	/* Execute test */
	this->execute_negative_test(tested_shader_type, shader_source);
}